

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void gc_call_finalizer(global_State *g,lua_State *L,cTValue *mo,GCobj *o)

{
  byte bVar1;
  GCSize GVar2;
  cTValue *pcVar3;
  int errcode_00;
  TValue *top;
  int errcode;
  GCSize oldt;
  uint8_t oldh;
  GCobj *o_local;
  cTValue *mo_local;
  lua_State *L_local;
  global_State *g_local;
  
  bVar1 = g->hookmask;
  GVar2 = (g->gc).threshold;
  g[1].tmptv.field_4.it = g[1].tmptv.field_4.it & 0xffffffef;
  g->hookmask = g->hookmask & 0x7f | 0x50;
  if ((bVar1 & 0x80) != 0) {
    lj_dispatch_update(g);
  }
  (g->gc).threshold = 0x800000000000;
  pcVar3 = L->top;
  *pcVar3 = *mo;
  pcVar3[1].u64 = 0xffffffffffffffff;
  pcVar3[2].u64 = (ulong)o | (ulong)((o->gch).gct ^ 0xffffffff) << 0x2f;
  L->top = pcVar3 + 3;
  errcode_00 = lj_vm_pcall(L,pcVar3 + 2,1,0xffffffffffffffff);
  g->hookmask = g->hookmask & 0xf | bVar1 & 0xf0;
  if ((bVar1 & 0x80) != 0) {
    lj_dispatch_update(g);
  }
  (g->gc).threshold = GVar2;
  if (errcode_00 != 0) {
    lj_err_throw(L,errcode_00);
  }
  return;
}

Assistant:

static void gc_call_finalizer(global_State *g, lua_State *L,
			      cTValue *mo, GCobj *o)
{
  /* Save and restore lots of state around the __gc callback. */
  uint8_t oldh = hook_save(g);
  GCSize oldt = g->gc.threshold;
  int errcode;
  TValue *top;
  lj_trace_abort(g);
  hook_entergc(g);  /* Disable hooks and new traces during __gc. */
  if (LJ_HASPROFILE && (oldh & HOOK_PROFILE)) lj_dispatch_update(g);
  g->gc.threshold = LJ_MAX_MEM;  /* Prevent GC steps. */
  top = L->top;
  copyTV(L, top++, mo);
  if (LJ_FR2) setnilV(top++);
  setgcV(L, top, o, ~o->gch.gct);
  L->top = top+1;
  errcode = lj_vm_pcall(L, top, 1+0, -1);  /* Stack: |mo|o| -> | */
  hook_restore(g, oldh);
  if (LJ_HASPROFILE && (oldh & HOOK_PROFILE)) lj_dispatch_update(g);
  g->gc.threshold = oldt;  /* Restore GC threshold. */
  if (errcode)
    lj_err_throw(L, errcode);  /* Propagate errors. */
}